

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_impl.hpp
# Opt level: O0

either * toml::detail::syntax::allowed_comment_char(spec *s)

{
  long in_RSI;
  either *in_RDI;
  char_type in_stack_ffffffffffffff0e;
  char_type in_stack_ffffffffffffff0f;
  non_ascii *in_stack_ffffffffffffff10;
  non_ascii *pnVar1;
  non_ascii *in_stack_ffffffffffffff28;
  character_in_range *in_stack_ffffffffffffff30;
  character_in_range *args_1;
  character *in_stack_ffffffffffffff38;
  character_in_range *args;
  either *peVar2;
  spec *in_stack_ffffffffffffff78;
  non_ascii *in_stack_ffffffffffffff80;
  undefined1 local_78 [72];
  character_in_range local_30;
  
  if ((*(byte *)(in_RSI + 0xc) & 1) == 0) {
    pnVar1 = (non_ascii *)local_78;
    peVar2 = in_RDI;
    character::character((character *)pnVar1,in_stack_ffffffffffffff0f);
    character_in_range::character_in_range
              ((character_in_range *)pnVar1,in_stack_ffffffffffffff0f,in_stack_ffffffffffffff0e);
    non_ascii::non_ascii(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    either::
    either<toml::detail::character,toml::detail::character_in_range,toml::detail::syntax::non_ascii>
              (peVar2,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28)
    ;
    non_ascii::~non_ascii(pnVar1);
    character_in_range::~character_in_range((character_in_range *)0x64e535);
    character::~character((character *)0x64e542);
  }
  else {
    pnVar1 = (non_ascii *)&stack0xffffffffffffffe0;
    peVar2 = in_RDI;
    character_in_range::character_in_range
              ((character_in_range *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f,
               in_stack_ffffffffffffff0e);
    args_1 = &local_30;
    character_in_range::character_in_range
              ((character_in_range *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0f,
               in_stack_ffffffffffffff0e);
    args = (character_in_range *)(local_78 + 0x20);
    non_ascii::non_ascii(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    either::
    either<toml::detail::character_in_range,toml::detail::character_in_range,toml::detail::syntax::non_ascii>
              (peVar2,args,args_1,pnVar1);
    non_ascii::~non_ascii(in_stack_ffffffffffffff10);
    character_in_range::~character_in_range((character_in_range *)0x64e46d);
    character_in_range::~character_in_range((character_in_range *)0x64e47a);
  }
  return in_RDI;
}

Assistant:

TOML11_INLINE either allowed_comment_char(const spec& s)
{
    if(s.v1_1_0_allow_control_characters_in_comments)
    {
        return either(
            character_in_range(0x01, 0x09),
            character_in_range(0x0E, 0x7F),
            non_ascii(s)
        );
    }
    else
    {
        return either(
            character(0x09),
            character_in_range(0x20, 0x7E),
            non_ascii(s)
        );
    }
}